

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_push_stack(mpack_tree_parser_t *parser,mpack_node_data_t *first_child,size_t total)

{
  size_t sVar1;
  mpack_level_t *pmVar2;
  mpack_level_t *new_stack_1;
  mpack_level_t *new_stack;
  size_t new_depth;
  size_t total_local;
  mpack_node_data_t *first_child_local;
  mpack_tree_parser_t *parser_local;
  
  if (total == 0) {
    return;
  }
  if (parser->level + 1 == parser->depth) {
    sVar1 = parser->depth;
    if ((parser->stack_owned & 1U) == 0) {
      pmVar2 = (mpack_level_t *)malloc(sVar1 << 5);
      if (pmVar2 == (mpack_level_t *)0x0) {
        mpack_tree_flag_error(parser->tree,mpack_error_memory);
        return;
      }
      memcpy(pmVar2,parser->stack,parser->depth << 4);
      parser->stack = pmVar2;
      parser->stack_owned = true;
    }
    else {
      pmVar2 = (mpack_level_t *)mpack_realloc(parser->stack,parser->depth << 4,sVar1 << 5);
      if (pmVar2 == (mpack_level_t *)0x0) {
        mpack_tree_flag_error(parser->tree,mpack_error_memory);
        return;
      }
      parser->stack = pmVar2;
    }
    parser->depth = sVar1 << 1;
  }
  parser->level = parser->level + 1;
  parser->stack[parser->level].child = first_child;
  parser->stack[parser->level].left = total;
  return;
}

Assistant:

static void mpack_tree_push_stack(mpack_tree_parser_t* parser, mpack_node_data_t* first_child, size_t total) {

    // No need to push empty containers
    if (total == 0)
        return;

    // Make sure we have enough room in the stack
    if (parser->level + 1 == parser->depth) {
        #ifdef MPACK_MALLOC
        size_t new_depth = parser->depth * 2;
        mpack_log("growing stack to depth %i\n", (int)new_depth);

        // Replace the stack-allocated parsing stack
        if (!parser->stack_owned) {
            mpack_level_t* new_stack = (mpack_level_t*)MPACK_MALLOC(sizeof(mpack_level_t) * new_depth);
            if (!new_stack) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            mpack_memcpy(new_stack, parser->stack, sizeof(mpack_level_t) * parser->depth);
            parser->stack = new_stack;
            parser->stack_owned = true;

        // Realloc the allocated parsing stack
        } else {
            mpack_level_t* new_stack = (mpack_level_t*)mpack_realloc(parser->stack,
                    sizeof(mpack_level_t) * parser->depth, sizeof(mpack_level_t) * new_depth);
            if (!new_stack) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            parser->stack = new_stack;
        }
        parser->depth = new_depth;
        #else
        mpack_tree_flag_error(parser->tree, mpack_error_too_big);
        return;
        #endif
    }

    // Push the contents of this node onto the parsing stack
    ++parser->level;
    parser->stack[parser->level].child = first_child;
    parser->stack[parser->level].left = total;
}